

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_name.c
# Opt level: O0

ares_status_t
ares_dns_name_write(ares_buf_t *buf,ares_llist_t **list,ares_bool_t validate_hostname,char *name)

{
  size_t sVar1;
  size_t idx;
  size_t sVar2;
  size_t sVar3;
  ares_buf_t *buf_00;
  uchar *data;
  unsigned_short u16;
  uchar *ptr;
  ares_buf_t *lbuf;
  size_t len;
  size_t i;
  char local_258 [4];
  ares_status_t status;
  char name_copy [512];
  ares_array_t *labels;
  size_t pos;
  size_t orig_name_len;
  size_t name_len;
  ares_nameoffset_t *off;
  char *name_local;
  ares_bool_t validate_hostname_local;
  ares_llist_t **list_local;
  ares_buf_t *buf_local;
  
  name_len = 0;
  idx = ares_buf_len(buf);
  name_copy[0x1f8] = '\0';
  name_copy[0x1f9] = '\0';
  name_copy[0x1fa] = '\0';
  name_copy[0x1fb] = '\0';
  name_copy[0x1fc] = '\0';
  name_copy[0x1fd] = '\0';
  name_copy[0x1fe] = '\0';
  name_copy[0x1ff] = '\0';
  if ((buf == (ares_buf_t *)0x0) || (name == (char *)0x0)) {
    return ARES_EFORMERR;
  }
  name_copy._504_8_ = ares_array_create(8,ares_dns_labels_free_cb);
  if ((ares_array_t *)name_copy._504_8_ == (ares_array_t *)0x0) {
    return ARES_ENOMEM;
  }
  sVar2 = ares_strcpy(local_258,name,0x200);
  orig_name_len = sVar2;
  if (((list != (ares_llist_t **)0x0) &&
      (name_len = (size_t)ares_nameoffset_find(*list,local_258),
      (ares_nameoffset_t *)name_len != (ares_nameoffset_t *)0x0)) &&
     (((ares_nameoffset_t *)name_len)->name_len != sVar2)) {
    orig_name_len = sVar2 - (((ares_nameoffset_t *)name_len)->name_len + 1);
    local_258[orig_name_len] = '\0';
  }
  if ((name_len == 0) || (*(size_t *)(name_len + 8) != sVar2)) {
    i._4_4_ = ares_split_dns_name((ares_array_t *)name_copy._504_8_,validate_hostname,local_258);
    if (i._4_4_ != ARES_SUCCESS) goto LAB_0012d986;
    len = 0;
    while( true ) {
      sVar1 = len;
      i._4_4_ = 0;
      sVar3 = ares_array_len((ares_array_t *)name_copy._504_8_);
      if (sVar3 <= sVar1) break;
      lbuf = (ares_buf_t *)0x0;
      buf_00 = ares_dns_labels_get_at((ares_array_t *)name_copy._504_8_,len);
      data = ares_buf_peek(buf_00,(size_t *)&lbuf);
      i._4_4_ = ares_buf_append_byte(buf,(uchar)lbuf);
      if ((i._4_4_ != ARES_SUCCESS) ||
         (i._4_4_ = ares_buf_append(buf,data,(size_t)lbuf), i._4_4_ != ARES_SUCCESS))
      goto LAB_0012d986;
      len = len + 1;
    }
    if (name_len == 0) {
      i._4_4_ = ares_buf_append_byte(buf,'\0');
      if (i._4_4_ != ARES_SUCCESS) goto LAB_0012d986;
      i._4_4_ = 0;
    }
  }
  if (name_len != 0) {
    i._4_4_ = ares_buf_append_be16(buf,(ushort)*(undefined8 *)(name_len + 0x10) & 0x3fff | 0xc000);
    if (i._4_4_ != ARES_SUCCESS) goto LAB_0012d986;
    i._4_4_ = 0;
  }
  if (((list == (ares_llist_t **)0x0) ||
      (((name_len != 0 && (*(size_t *)(name_len + 8) == sVar2)) || (orig_name_len == 0)))) ||
     (i._4_4_ = ares_nameoffset_create(list,name,idx), i._4_4_ == ARES_SUCCESS)) {
    i._4_4_ = ARES_SUCCESS;
  }
LAB_0012d986:
  ares_array_destroy((ares_array_t *)name_copy._504_8_);
  return i._4_4_;
}

Assistant:

ares_status_t ares_dns_name_write(ares_buf_t *buf, ares_llist_t **list,
                                  ares_bool_t validate_hostname,
                                  const char *name)
{
  const ares_nameoffset_t *off = NULL;
  size_t                   name_len;
  size_t                   orig_name_len;
  size_t                   pos    = ares_buf_len(buf);
  ares_array_t            *labels = NULL;
  char                     name_copy[512];
  ares_status_t            status;

  if (buf == NULL || name == NULL) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  labels = ares_array_create(sizeof(ares_buf_t *), ares_dns_labels_free_cb);
  if (labels == NULL) {
    return ARES_ENOMEM;
  }

  /* NOTE: due to possible escaping, name_copy buffer is > 256 to allow for
   *       this */
  name_len      = ares_strcpy(name_copy, name, sizeof(name_copy));
  orig_name_len = name_len;

  /* Find longest match */
  if (list != NULL) {
    off = ares_nameoffset_find(*list, name_copy);
    if (off != NULL && off->name_len != name_len) {
      /* truncate */
      name_len            -= (off->name_len + 1);
      name_copy[name_len]  = 0;
    }
  }

  /* Output labels */
  if (off == NULL || off->name_len != orig_name_len) {
    size_t i;

    status = ares_split_dns_name(labels, validate_hostname, name_copy);
    if (status != ARES_SUCCESS) {
      goto done;
    }

    for (i = 0; i < ares_array_len(labels); i++) {
      size_t               len  = 0;
      const ares_buf_t    *lbuf = ares_dns_labels_get_at(labels, i);
      const unsigned char *ptr  = ares_buf_peek(lbuf, &len);

      status = ares_buf_append_byte(buf, (unsigned char)(len & 0xFF));
      if (status != ARES_SUCCESS) {
        goto done; /* LCOV_EXCL_LINE: OutOfMemory */
      }

      status = ares_buf_append(buf, ptr, len);
      if (status != ARES_SUCCESS) {
        goto done; /* LCOV_EXCL_LINE: OutOfMemory */
      }
    }

    /* If we are NOT jumping to another label, output terminator */
    if (off == NULL) {
      status = ares_buf_append_byte(buf, 0);
      if (status != ARES_SUCCESS) {
        goto done; /* LCOV_EXCL_LINE: OutOfMemory */
      }
    }
  }

  /* Output name compression offset jump */
  if (off != NULL) {
    unsigned short u16 =
      (unsigned short)0xC000 | (unsigned short)(off->idx & 0x3FFF);
    status = ares_buf_append_be16(buf, u16);
    if (status != ARES_SUCCESS) {
      goto done; /* LCOV_EXCL_LINE: OutOfMemory */
    }
  }

  /* Store pointer for future jumps as long as its not an exact match for
   * a prior entry */
  if (list != NULL && (off == NULL || off->name_len != orig_name_len) &&
      name_len > 0) {
    status = ares_nameoffset_create(list, name /* not truncated copy! */, pos);
    if (status != ARES_SUCCESS) {
      goto done; /* LCOV_EXCL_LINE: OutOfMemory */
    }
  }

  status = ARES_SUCCESS;

done:
  ares_array_destroy(labels);
  return status;
}